

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.c
# Opt level: O0

void threaded_tests(zt_unit_test *test,void *data)

{
  zt_unit_test *in_RDI;
  char *msg_1;
  char *msg;
  zt_log_ty *ologger;
  zt_log_ty *lfile;
  int i;
  pthread_t t2;
  pthread_t t1;
  zt_log_ty *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar1;
  pthread_t local_20;
  pthread_t local_18 [2];
  zt_unit_test *local_8;
  
  local_8 = in_RDI;
  zt_log_file((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
              (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0);
  zt_log_logger(in_stack_ffffffffffffffb8);
  for (iVar1 = 0; iVar1 < 100; iVar1 = iVar1 + 1) {
    pthread_create(local_18,(pthread_attr_t *)0x0,log_1,(void *)0x0);
    pthread_create(&local_20,(pthread_attr_t *)0x0,log_2,local_18);
    pthread_join(local_20,(void **)0x0);
  }
  if (_count1 == 100) {
    zt_unit_test_add_assertion(local_8);
    if (_count2 == 100) {
      zt_unit_test_add_assertion(local_8);
      zt_log_logger(in_stack_ffffffffffffffb8);
      zt_log_close((zt_log_ty *)0x11b379);
      unlink("test.log");
      return;
    }
    iVar1 = zt_unit_printf(&local_8->error,"%s : %s:%d","_count2 == 100",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
                           ,0xc3);
    if (iVar1 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  iVar1 = zt_unit_printf(&local_8->error,"%s : %s:%d","_count1 == 100",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
                         ,0xc2);
  if (iVar1 == 0) {
    local_8->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)local_8->env,1);
}

Assistant:

void
threaded_tests(struct zt_unit_test *test, void *data UNUSED) {
    pthread_t   t1;
    pthread_t   t2;
    int         i;
    zt_log_ty   * lfile;
    zt_log_ty   * ologger;

    lfile = zt_log_file( "test.log", ZT_LOG_FILE_APPEND, 0);
    ologger = zt_log_logger(lfile);

    for(i = 0; i < 100; i++) {
        pthread_create(&t1, NULL, log_1, NULL);
        pthread_create(&t2, NULL, log_2, &t1);

        pthread_join(t2, NULL);
    }

    ZT_UNIT_ASSERT(test, _count1 == 100);
    ZT_UNIT_ASSERT(test, _count2 == 100);

    zt_log_logger(ologger);
    zt_log_close(lfile);

    unlink("test.log");
}